

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextIO.cpp
# Opt level: O0

void __thiscall
LogMsgTy::LogMsgTy(LogMsgTy *this,char *_fn,int _ln,char *_func,logLevelTy _lvl,char *_msg)

{
  unsigned_long uVar1;
  undefined4 in_EDX;
  char *in_RSI;
  unsigned_long *in_RDI;
  undefined4 in_R8D;
  string *in_R9;
  float fVar2;
  DataRefs *in_stack_ffffffffffffff68;
  allocator<char> *__a;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  allocator<char> local_46;
  allocator<char> local_45 [20];
  allocator<char> local_31;
  
  gLogCnt = gLogCnt + 1;
  *in_RDI = gLogCnt;
  uVar1 = std::chrono::_V2::system_clock::now();
  in_RDI[1] = uVar1;
  fVar2 = DataRefs::GetMiscNetwTime(in_stack_ffffffffffffff68);
  *(float *)(in_RDI + 2) = fVar2;
  __a = (allocator<char> *)(in_RDI + 3);
  this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_31;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_00,in_RSI,__a);
  std::allocator<char>::~allocator(&local_31);
  *(undefined4 *)(in_RDI + 7) = in_EDX;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_00,in_RSI,__a);
  std::allocator<char>::~allocator(local_45);
  *(undefined4 *)(in_RDI + 0xc) = in_R8D;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_00,in_RSI,__a);
  std::allocator<char>::~allocator(&local_46);
  *(undefined1 *)(in_RDI + 0x11) = 0;
  str_replPers(in_R9);
  return;
}

Assistant:

LogMsgTy::LogMsgTy (const char* _fn, int _ln, const char* _func,
                    logLevelTy _lvl, const char* _msg) :
counter(++gLogCnt),
wallTime(std::chrono::system_clock::now()),
netwTime(dataRefs.GetMiscNetwTime()),
fileName(_fn), ln(_ln), func(_func), lvl(_lvl), msg(_msg), bFlushed(false)
{
    // Remove personal information
    str_replPers(msg);

}